

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.cc
# Opt level: O3

Tensor * __thiscall
cnn::SimpleExecutionEngine::incremental_forward(SimpleExecutionEngine *this,VariableIndex *i)

{
  uint *puVar1;
  ComputationGraph *pCVar2;
  Node *this_00;
  pointer pVVar3;
  pointer pTVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  value_type *__val;
  pointer pVVar8;
  ulong uVar9;
  float *pfVar10;
  undefined4 extraout_var;
  void *pvVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  int iVar15;
  vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> local_48;
  
  uVar12 = i->t;
  uVar9 = (ulong)uVar12;
  pCVar2 = (this->super_ExecutionEngine).cg;
  if ((ulong)((long)(pCVar2->nodes).super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(pCVar2->nodes).super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3) <= uVar9) {
    __assert_fail("i < cg.nodes.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/clab[P]att-coref/cnn/cnn/exec.cc"
                  ,0x27,
                  "virtual const Tensor &cnn::SimpleExecutionEngine::incremental_forward(VariableIndex)"
                 );
  }
  uVar13 = (this->num_nodes_evaluated).t;
  if (uVar13 == 0) {
    fxs->used = 0;
  }
  if (uVar12 < uVar13) goto LAB_0018d551;
  std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::resize(&this->nfxs,(ulong)(uVar12 + 1));
  local_48.super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(0x80);
  local_48.super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_48.super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>.
       _M_impl.super__Vector_impl_data._M_start + 0x10;
  *local_48.super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>._M_impl.
   super__Vector_impl_data._M_start = (Tensor *)0x0;
  local_48.super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>._M_impl.
  super__Vector_impl_data._M_start[1] = (Tensor *)0x0;
  local_48.super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>._M_impl.
  super__Vector_impl_data._M_start[2] = (Tensor *)0x0;
  local_48.super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>._M_impl.
  super__Vector_impl_data._M_start[3] = (Tensor *)0x0;
  local_48.super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>._M_impl.
  super__Vector_impl_data._M_start[4] = (Tensor *)0x0;
  local_48.super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>._M_impl.
  super__Vector_impl_data._M_start[5] = (Tensor *)0x0;
  local_48.super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>._M_impl.
  super__Vector_impl_data._M_start[6] = (Tensor *)0x0;
  local_48.super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>._M_impl.
  super__Vector_impl_data._M_start[7] = (Tensor *)0x0;
  local_48.super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>._M_impl.
  super__Vector_impl_data._M_start[8] = (Tensor *)0x0;
  local_48.super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>._M_impl.
  super__Vector_impl_data._M_start[9] = (Tensor *)0x0;
  local_48.super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>._M_impl.
  super__Vector_impl_data._M_start[10] = (Tensor *)0x0;
  local_48.super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>._M_impl.
  super__Vector_impl_data._M_start[0xb] = (Tensor *)0x0;
  local_48.super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>._M_impl.
  super__Vector_impl_data._M_start[0xc] = (Tensor *)0x0;
  local_48.super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>._M_impl.
  super__Vector_impl_data._M_start[0xd] = (Tensor *)0x0;
  local_48.super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>._M_impl.
  super__Vector_impl_data._M_start[0xe] = (Tensor *)0x0;
  local_48.super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>._M_impl.
  super__Vector_impl_data._M_start[0xf] = (Tensor *)0x0;
  uVar12 = (this->num_nodes_evaluated).t;
  local_48.super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_48.super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (i->t < uVar12) {
LAB_0018d544:
    operator_delete(local_48.
                    super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>.
                    _M_impl.super__Vector_impl_data._M_start);
    uVar13 = i->t;
  }
  else {
    do {
      this_00 = (((this->super_ExecutionEngine).cg)->nodes).
                super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
                super__Vector_impl_data._M_start[uVar12];
      std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::resize
                (&local_48,
                 (ulong)((long)(this_00->args).
                               super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this_00->args).
                              super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 2 & 0xffffffff);
      pVVar8 = (this_00->args).
               super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
               super__Vector_impl_data._M_start;
      pVVar3 = (this_00->args).
               super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (pVVar8 != pVVar3) {
        uVar12 = 0;
        do {
          local_48.super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar12] =
               (this->nfxs).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
               super__Vector_impl_data._M_start + pVVar8->t;
          uVar12 = uVar12 + 1;
          pVVar8 = pVVar8 + 1;
        } while (pVVar8 != pVVar3);
      }
      uVar12 = (this->num_nodes_evaluated).t;
      pTVar4 = (this->nfxs).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
               super__Vector_impl_data._M_start;
      pTVar4[uVar12].d.bd = (this_00->dim).bd;
      uVar5 = *(undefined8 *)(this_00->dim).d;
      uVar6 = *(undefined8 *)((this_00->dim).d + 2);
      uVar7 = *(undefined8 *)((this_00->dim).d + 6);
      puVar1 = pTVar4[uVar12].d.d + 4;
      *(undefined8 *)puVar1 = *(undefined8 *)((this_00->dim).d + 4);
      *(undefined8 *)(puVar1 + 2) = uVar7;
      *(undefined8 *)pTVar4[uVar12].d.d = uVar5;
      *(undefined8 *)(pTVar4[uVar12].d.d + 2) = uVar6;
      uVar9 = (ulong)(this_00->dim).nd;
      if (uVar9 == 0) {
        iVar15 = 1;
      }
      else {
        iVar15 = 1;
        uVar14 = 0;
        do {
          iVar15 = iVar15 * (this_00->dim).d[uVar14];
          uVar14 = uVar14 + 1;
        } while (uVar9 != uVar14);
      }
      pfVar10 = (float *)AlignedMemoryPool::allocate(fxs,(ulong)(iVar15 * (this_00->dim).bd) << 2);
      (this->nfxs).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
      super__Vector_impl_data._M_start[(this->num_nodes_evaluated).t].v = pfVar10;
      if (pfVar10 == (float *)0x0) {
        std::operator<<((ostream *)&std::cerr,"out of memory\n");
LAB_0018d594:
        abort();
      }
      iVar15 = (*this_00->_vptr_Node[4])(this_00);
      if (CONCAT44(extraout_var,iVar15) == 0) {
        pvVar11 = (void *)0x0;
      }
      else {
        pvVar11 = AlignedMemoryPool::allocate(fxs,CONCAT44(extraout_var,iVar15));
        if (pvVar11 == (void *)0x0) {
          std::operator<<((ostream *)&std::cerr,"aux out of memory\n");
          goto LAB_0018d594;
        }
      }
      this_00->aux_mem = pvVar11;
      Node::forward(this_00,&local_48,
                    (this->nfxs).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>.
                    _M_impl.super__Vector_impl_data._M_start + (this->num_nodes_evaluated).t);
      uVar12 = (this->num_nodes_evaluated).t + 1;
      (this->num_nodes_evaluated).t = uVar12;
      uVar13 = i->t;
    } while (uVar12 <= uVar13);
    if (local_48.super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) goto LAB_0018d544;
  }
  uVar9 = (ulong)uVar13;
LAB_0018d551:
  return (this->nfxs).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
         super__Vector_impl_data._M_start + uVar9;
}

Assistant:

const Tensor& SimpleExecutionEngine::incremental_forward(VariableIndex i) {
  assert(i < cg.nodes.size());

  // free any old memory if this is a new CG
  if (num_nodes_evaluated == 0) fxs->free();

  if (i >= num_nodes_evaluated) {
    nfxs.resize(i + 1);

    //vector<string> dummy(5, "x");
    vector<const Tensor*> xs(16);
    for (; num_nodes_evaluated <= i; ++num_nodes_evaluated) {
      const Node* node = cg.nodes[num_nodes_evaluated];
      xs.resize(node->arity());
      unsigned ai = 0;
      for (VariableIndex arg : node->args) {
        xs[ai] = &nfxs[arg];
        ++ai;
      }
      nfxs[num_nodes_evaluated].d = node->dim;
      nfxs[num_nodes_evaluated].v = static_cast<float*>(fxs->allocate(node->dim.size() * sizeof(float)));
      if (nfxs[num_nodes_evaluated].v == nullptr) {
        cerr << "out of memory\n";
        abort();
      }
      void* aux_mem = nullptr;
      size_t aux_size = node->aux_storage_size();
      if (aux_size) {
        aux_mem = fxs->allocate(aux_size);
        if (!aux_mem) {
          cerr << "aux out of memory\n";
          abort();
        }
      }
      node->aux_mem = aux_mem;
      node->forward(xs, nfxs[num_nodes_evaluated]);
    }
  }
  return nfxs[i];
}